

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExportFileGenerator.cxx
# Opt level: O1

void getCompatibleInterfaceProperties
               (cmGeneratorTarget *target,
               set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *ifaceProperties,string *config)

{
  pointer pcVar1;
  cmGeneratorTarget *pcVar2;
  TargetType TVar3;
  cmComputeLinkInformation *this;
  ItemVector *pIVar4;
  cmLocalGenerator *this_00;
  string *psVar5;
  ostream *poVar6;
  pointer pIVar7;
  ostringstream e;
  string local_1c8;
  undefined1 local_1a8 [112];
  ios_base local_138 [264];
  
  TVar3 = cmGeneratorTarget::GetType(target);
  if (TVar3 != OBJECT_LIBRARY) {
    this = cmGeneratorTarget::GetLinkInformation(target,config);
    if (this == (cmComputeLinkInformation *)0x0) {
      this_00 = cmGeneratorTarget::GetLocalGenerator(target);
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,"Exporting the target \"",0x16);
      psVar5 = cmGeneratorTarget::GetName_abi_cxx11_(target);
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_1a8,(psVar5->_M_dataplus)._M_p,psVar5->_M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar6,"\" is not allowed since its linker language cannot be determined",0x3f);
      std::__cxx11::stringbuf::str();
      cmLocalGenerator::IssueMessage(this_00,FATAL_ERROR,&local_1c8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
        operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
      std::ios_base::~ios_base(local_138);
    }
    else {
      pIVar4 = cmComputeLinkInformation::GetItems(this);
      pIVar7 = (pIVar4->
               super__Vector_base<cmComputeLinkInformation::Item,_std::allocator<cmComputeLinkInformation::Item>_>
               )._M_impl.super__Vector_impl_data._M_start;
      if (pIVar7 != (pIVar4->
                    super__Vector_base<cmComputeLinkInformation::Item,_std::allocator<cmComputeLinkInformation::Item>_>
                    )._M_impl.super__Vector_impl_data._M_finish) {
        pcVar1 = local_1a8 + 0x10;
        do {
          pcVar2 = pIVar7->Target;
          if (pcVar2 != (cmGeneratorTarget *)0x0) {
            local_1a8._0_8_ = pcVar1;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_1a8,"COMPATIBLE_INTERFACE_BOOL","");
            getPropertyContents(pcVar2,(string *)local_1a8,ifaceProperties);
            if ((pointer)local_1a8._0_8_ != pcVar1) {
              operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
            }
            pcVar2 = pIVar7->Target;
            local_1a8._0_8_ = pcVar1;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_1a8,"COMPATIBLE_INTERFACE_STRING","");
            getPropertyContents(pcVar2,(string *)local_1a8,ifaceProperties);
            if ((pointer)local_1a8._0_8_ != pcVar1) {
              operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
            }
            pcVar2 = pIVar7->Target;
            local_1a8._0_8_ = pcVar1;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_1a8,"COMPATIBLE_INTERFACE_NUMBER_MIN","");
            getPropertyContents(pcVar2,(string *)local_1a8,ifaceProperties);
            if ((pointer)local_1a8._0_8_ != pcVar1) {
              operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
            }
            pcVar2 = pIVar7->Target;
            local_1a8._0_8_ = pcVar1;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_1a8,"COMPATIBLE_INTERFACE_NUMBER_MAX","");
            getPropertyContents(pcVar2,(string *)local_1a8,ifaceProperties);
            if ((pointer)local_1a8._0_8_ != pcVar1) {
              operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
            }
          }
          pIVar7 = pIVar7 + 1;
        } while (pIVar7 != (pIVar4->
                           super__Vector_base<cmComputeLinkInformation::Item,_std::allocator<cmComputeLinkInformation::Item>_>
                           )._M_impl.super__Vector_impl_data._M_finish);
      }
    }
  }
  return;
}

Assistant:

void getCompatibleInterfaceProperties(cmGeneratorTarget* target,
                                      std::set<std::string>& ifaceProperties,
                                      const std::string& config)
{
  if (target->GetType() == cmStateEnums::OBJECT_LIBRARY) {
    // object libraries have no link information, so nothing to compute
    return;
  }

  cmComputeLinkInformation* info = target->GetLinkInformation(config);

  if (!info) {
    cmLocalGenerator* lg = target->GetLocalGenerator();
    std::ostringstream e;
    e << "Exporting the target \"" << target->GetName()
      << "\" is not "
         "allowed since its linker language cannot be determined";
    lg->IssueMessage(cmake::FATAL_ERROR, e.str());
    return;
  }

  const cmComputeLinkInformation::ItemVector& deps = info->GetItems();

  for (cmComputeLinkInformation::ItemVector::const_iterator li = deps.begin();
       li != deps.end(); ++li) {
    if (!li->Target) {
      continue;
    }
    getPropertyContents(li->Target, "COMPATIBLE_INTERFACE_BOOL",
                        ifaceProperties);
    getPropertyContents(li->Target, "COMPATIBLE_INTERFACE_STRING",
                        ifaceProperties);
    getPropertyContents(li->Target, "COMPATIBLE_INTERFACE_NUMBER_MIN",
                        ifaceProperties);
    getPropertyContents(li->Target, "COMPATIBLE_INTERFACE_NUMBER_MAX",
                        ifaceProperties);
  }
}